

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

string * __thiscall
duckdb_re2::ProgToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb_re2 *this,Prog *prog,Workq *q)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  Inst *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string local_70;
  string local_50;
  
  paVar5 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar5;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1._0_1_ = prog->anchor_start_;
  iVar1._1_1_ = prog->anchor_end_;
  iVar1._2_1_ = prog->reversed_;
  iVar1._3_1_ = prog->did_flatten_;
  if (iVar1 != 0) {
    puVar4 = (uint *)prog->prefix_size_;
    do {
      uVar2 = *puVar4;
      this_00 = (Inst *)((long)(int)uVar2 * 8 + *(long *)(this + 0x78));
      Prog::Inst::Dump_abi_cxx11_(&local_50,this_00);
      StringPrintf_abi_cxx11_
                (&local_70,"%d. %s\n",(ulong)uVar2,local_50._M_dataplus._M_p,in_R8,in_R9,paVar5);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (0xf < this_00->out_opcode_) {
        SparseSetT<void>::InsertInternal((SparseSetT<void> *)prog,true,this_00->out_opcode_ >> 4);
      }
      if (((this_00->out_opcode_ & 6) == 0) && ((this_00->field_1).cap_ != 0)) {
        SparseSetT<void>::InsertInternal((SparseSetT<void> *)prog,true,(this_00->field_1).cap_);
      }
      puVar4 = puVar4 + 1;
      iVar3._0_1_ = prog->anchor_start_;
      iVar3._1_1_ = prog->anchor_end_;
      iVar3._2_1_ = prog->reversed_;
      iVar3._3_1_ = prog->did_flatten_;
    } while (puVar4 != (uint *)((long)iVar3 * 4 + prog->prefix_size_));
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string ProgToString(Prog* prog, Workq* q) {
  std::string s;
  for (Workq::iterator i = q->begin(); i != q->end(); ++i) {
    int id = *i;
    Prog::Inst* ip = prog->inst(id);
    s += StringPrintf("%d. %s\n", id, ip->Dump().c_str());
    AddToQueue(q, ip->out());
    if (ip->opcode() == kInstAlt || ip->opcode() == kInstAltMatch)
      AddToQueue(q, ip->out1());
  }
  return s;
}